

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSAtom js_parse_destructuring_var(JSParseState *s,int tok,int is_arg)

{
  uint name;
  JSAtomStruct *pJVar1;
  int iVar2;
  
  if (((s->token).val == -0x7d) && ((s->token).u.ident.is_reserved == 0)) {
    name = (s->token).u.ident.atom;
    if (((s->cur_func->js_mode & 1) == 0) || ((name != 0x4d && (name != 0x3a)))) {
      if (0xd1 < (int)name) {
        pJVar1 = s->ctx->rt->atom_array[name];
        (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
      }
      if (((tok == 0) || (iVar2 = js_parse_check_duplicate_parameter(s,name), iVar2 == 0)) &&
         (iVar2 = next_token(s), iVar2 == 0)) {
        return name;
      }
      JS_FreeAtom(s->ctx,name);
      return 0;
    }
  }
  js_parse_error(s,"invalid destructuring target");
  return 0;
}

Assistant:

static JSAtom js_parse_destructuring_var(JSParseState *s, int tok, int is_arg)
{
    JSAtom name;

    if (!(s->token.val == TOK_IDENT && !s->token.u.ident.is_reserved)
    ||  ((s->cur_func->js_mode & JS_MODE_STRICT) &&
         (s->token.u.ident.atom == JS_ATOM_eval || s->token.u.ident.atom == JS_ATOM_arguments))) {
        js_parse_error(s, "invalid destructuring target");
        return JS_ATOM_NULL;
    }
    name = JS_DupAtom(s->ctx, s->token.u.ident.atom);
    if (is_arg && js_parse_check_duplicate_parameter(s, name))
        goto fail;
    if (next_token(s))
        goto fail;

    return name;
fail:
    JS_FreeAtom(s->ctx, name);
    return JS_ATOM_NULL;
}